

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetFactory.cpp
# Opt level: O3

void __thiscall Rml::StyleSheetFactory::StyleSheetFactory(StyleSheetFactory *this)

{
  size_t *psVar1;
  long lVar2;
  long *plVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
  local_228;
  undefined1 *local_200 [2];
  undefined1 local_1f0 [16];
  undefined4 local_1e0;
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  undefined4 local_1b8;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined4 local_190;
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined4 local_168;
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined4 local_140;
  undefined1 *local_138 [2];
  undefined1 local_128 [16];
  undefined4 local_118;
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined4 local_f0;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined4 local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined4 local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined4 local_50;
  long *local_48 [2];
  long local_38 [2];
  undefined4 local_28;
  
  psVar1 = &(this->stylesheets).mMask;
  (this->stylesheets).mKeyVals = (Node *)psVar1;
  (this->stylesheets).mInfo = (uint8_t *)psVar1;
  (this->stylesheets).mNumElements = 0;
  (this->stylesheets).mMask = 0;
  (this->stylesheets).mMaxNumElementsAllowed = 0;
  (this->stylesheets).mInfoInc = 0x20;
  (this->stylesheets).mInfoHashShift = 0;
  local_228.first._M_dataplus._M_p = (pointer)&local_228.first.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"nth-child","");
  local_228.second = Nth_Child;
  local_200[0] = local_1f0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"nth-last-child","");
  local_1e0 = 2;
  local_1d8[0] = local_1c8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"nth-of-type","");
  local_1b8 = 3;
  local_1b0[0] = local_1a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"nth-last-of-type","");
  local_190 = 4;
  local_188[0] = local_178;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"first-child","");
  local_168 = 5;
  local_160[0] = local_150;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"last-child","");
  local_140 = 6;
  local_138[0] = local_128;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"first-of-type","");
  local_118 = 7;
  local_110[0] = local_100;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"last-of-type","");
  local_f0 = 8;
  local_e8[0] = local_d8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"only-child","");
  local_c8 = 9;
  local_c0[0] = local_b0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"only-of-type","");
  local_a0 = 10;
  local_98[0] = local_88;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"empty","");
  local_78 = 0xb;
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"not","");
  local_50 = 0xc;
  plVar3 = local_38;
  local_48[0] = plVar3;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"scope","");
  local_28 = 0xd;
  psVar1 = &(this->selectors).mMask;
  (this->selectors).mKeyVals = (Node *)psVar1;
  (this->selectors).mInfo = (uint8_t *)psVar1;
  (this->selectors).mNumElements = 0;
  (this->selectors).mMask = 0;
  (this->selectors).mMaxNumElementsAllowed = 0;
  (this->selectors).mInfoInc = 0x20;
  (this->selectors).mInfoHashShift = 0;
  robin_hood::detail::
  Table<true,80ul,std::__cxx11::string,Rml::StructuralSelectorType,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
  ::insert<robin_hood::pair<std::__cxx11::string,Rml::StructuralSelectorType>const*>
            ((Table<true,80ul,std::__cxx11::string,Rml::StructuralSelectorType,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
              *)&this->selectors,&local_228,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::StructuralSelectorType>
              *)&stack0xffffffffffffffe0);
  lVar2 = -0x208;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  return;
}

Assistant:

StyleSheetFactory::StyleSheetFactory() :
	selectors{
		{"nth-child", StructuralSelectorType::Nth_Child},
		{"nth-last-child", StructuralSelectorType::Nth_Last_Child},
		{"nth-of-type", StructuralSelectorType::Nth_Of_Type},
		{"nth-last-of-type", StructuralSelectorType::Nth_Last_Of_Type},
		{"first-child", StructuralSelectorType::First_Child},
		{"last-child", StructuralSelectorType::Last_Child},
		{"first-of-type", StructuralSelectorType::First_Of_Type},
		{"last-of-type", StructuralSelectorType::Last_Of_Type},
		{"only-child", StructuralSelectorType::Only_Child},
		{"only-of-type", StructuralSelectorType::Only_Of_Type},
		{"empty", StructuralSelectorType::Empty},
		{"not", StructuralSelectorType::Not},
		{"scope", StructuralSelectorType::Scope},
	}
{}